

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O2

void __thiscall KokkosTools::ChromeTracing::StackNode::print(StackNode *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"{\"name\": \"");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1,"\", \"cat\": \"");
  operator<<(poVar1,this->kind);
  poVar1 = std::operator<<(poVar1,"\", \"ph\": \"X");
  poVar1 = std::operator<<(poVar1,"\", \"ts\": \"");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\", \"dur\": \"");
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\", \"pid\": \"");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->rank);
  poVar1 = std::operator<<(poVar1,"\", \"tid\": \"");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0);
  std::operator<<(poVar1,"\", \"args\": {\"dummy\": 1}}\n");
  return;
}

Assistant:

void print(std::ostream &os) const {
    // {"name": "Asub", "cat": "PERF", "ph": "B", "pid": 22630, "tid": 22630,
    // "ts": 829},
    os << "{\"name\": \"" << name << "\", \"cat\": \"" << kind
       << "\", \"ph\": \"X"
       << "\", \"ts\": \"" << start_time - base_time << "\", \"dur\": \""
       << now() - start_time << "\", \"pid\": \"" << rank << "\", \"tid\": \""
       << 0 << "\", \"args\": {\"dummy\": 1}}\n";
  }